

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O2

void entryIncrease(UResourceDataEntry *entry)

{
  umtx_lock_63(&resbMutex);
  do {
    entry->fCountExisting = entry->fCountExisting + 1;
    entry = entry->fParent;
  } while (entry != (UResourceDataEntry *)0x0);
  umtx_unlock_63(&resbMutex);
  return;
}

Assistant:

static void entryIncrease(UResourceDataEntry *entry) {
    umtx_lock(&resbMutex);
    entry->fCountExisting++;
    while(entry->fParent != NULL) {
      entry = entry->fParent;
      entry->fCountExisting++;
    }
    umtx_unlock(&resbMutex);
}